

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_tt_GetGlyphShape(nk_tt_fontinfo *info,nk_allocator *alloc,int glyph_index,
                       nk_tt_vertex **pvertices)

{
  ushort *puVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  uchar *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar12;
  ushort uVar13;
  uint uVar14;
  int num_vertices;
  int iVar15;
  ulong uVar16;
  nk_tt_vertex *vertices;
  ushort *puVar17;
  nk_tt_vertex *dst0;
  long lVar18;
  short sVar19;
  ulong uVar20;
  uint uVar21;
  long lVar23;
  byte bVar24;
  byte bVar25;
  int sy;
  ushort uVar26;
  short sVar27;
  nk_tt_vertex *pnVar28;
  int iVar29;
  nk_int nVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  float fVar34;
  float fVar35;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  int cx;
  ushort *local_d8;
  ulong local_c8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  nk_tt_vertex *comp_verts;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  nk_tt_fontinfo *local_40;
  nk_tt_vertex **local_38;
  ulong uVar22;
  
  puVar5 = info->data;
  uVar14 = nk_tt__GetGlyfOffset(info,glyph_index);
  *pvertices = (nk_tt_vertex *)0x0;
  if ((int)uVar14 < 0) {
LAB_0013f979:
    uVar14 = 0;
  }
  else {
    uVar16 = (ulong)uVar14;
    uVar12 = CONCAT11(puVar5[uVar16],puVar5[uVar16 + 1]);
    local_38 = pvertices;
    if ((short)uVar12 < 1) {
      if (uVar12 == 0xffff) {
        uVar14 = 0;
        vertices = (nk_tt_vertex *)0x0;
        puVar17 = (ushort *)(puVar5 + uVar16 + 10);
        local_40 = info;
        for (bVar25 = 1; bVar25 != 0; bVar25 = bVar25 & 0x20) {
          comp_verts = (nk_tt_vertex *)0x0;
          bVar25 = *(byte *)((long)puVar17 + 1);
          if ((bVar25 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                          ,0x2c7e,
                          "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                         );
          }
          if ((bVar25 & 1) == 0) {
            iVar32 = (int)(char)puVar17[2];
            iVar33 = (int)((long)((ulong)*(byte *)((long)puVar17 + 5) << 0x38) >> 0x38);
            lVar18 = 6;
          }
          else {
            auVar8._9_7_ = 0;
            auVar8._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar7._10_6_ = 0;
            auVar7._0_10_ = SUB1610(auVar8 << 0x38,6);
            auVar6._11_5_ = 0;
            auVar6._0_11_ = SUB1611(auVar7 << 0x30,5);
            auVar9._1_12_ = SUB1612(auVar6 << 0x28,4);
            auVar9[0] = (char)puVar17[3];
            auVar9._13_3_ = 0;
            auVar37._1_14_ = SUB1614(auVar9 << 0x18,2);
            auVar37[0] = (char)puVar17[2];
            auVar37[0xf] = 0;
            auVar37 = ZEXT416((uint)*(byte *)((long)puVar17 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar17 + 5)) | auVar37 << 8;
            iVar32 = (int)auVar37._0_2_;
            iVar33 = (int)auVar37._2_2_;
            lVar18 = 8;
          }
          local_d8 = (ushort *)(lVar18 + (long)puVar17);
          if ((bVar25 & 8) == 0) {
            if ((bVar25 & 0x40) != 0) {
              puVar1 = local_d8 + 1;
              fVar40 = (float)(int)(short)(*local_d8 << 8 | *local_d8 >> 8) * 6.1035156e-05;
              local_d8 = local_d8 + 2;
              fVar39 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
              goto LAB_0013f70e;
            }
            if ((char)bVar25 < '\0') {
              fVar40 = (float)(int)CONCAT11((char)*local_d8,*(undefined1 *)((long)local_d8 + 1)) *
                       6.1035156e-05;
              fVar42 = (float)(int)((long)((ulong)CONCAT11((char)local_d8[2],
                                                           *(undefined1 *)((long)local_d8 + 5)) <<
                                          0x30) >> 0x30) * 6.1035156e-05;
              fVar35 = (float)(int)CONCAT11((char)local_d8[1],*(undefined1 *)((long)local_d8 + 3)) *
                       6.1035156e-05;
              fVar39 = (float)(int)((long)((ulong)CONCAT11((char)local_d8[3],
                                                           *(undefined1 *)((long)local_d8 + 7)) <<
                                          0x30) >> 0x30) * 6.1035156e-05;
              local_d8 = local_d8 + 4;
            }
            else {
              fVar40 = 1.0;
              fVar42 = 0.0;
              fVar35 = 0.0;
              fVar39 = 1.0;
            }
          }
          else {
            fVar40 = (float)(int)(short)(*local_d8 << 8 | *local_d8 >> 8) * 6.1035156e-05;
            local_d8 = local_d8 + 1;
            fVar39 = fVar40;
LAB_0013f70e:
            fVar42 = 0.0;
            fVar35 = 0.0;
          }
          fVar44 = fVar40 * fVar40 + fVar35 * fVar35;
          fVar45 = fVar42 * fVar42 + fVar39 * fVar39;
          uStack_50 = 0;
          uStack_4c = 0;
          fVar34 = (float)(0x5f375a84 - ((uint)fVar44 >> 1));
          fVar38 = (float)(0x5f375a84 - ((uint)fVar45 >> 1));
          local_58 = CONCAT44(fVar45,fVar44);
          uVar21 = nk_tt_GetGlyphShape(info,alloc,(uint)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8),
                                       &comp_verts);
          pnVar28 = comp_verts;
          if (0 < (int)uVar21) {
            fVar34 = (float)local_58 * (fVar44 * -0.5 * fVar34 * fVar34 + 1.5) * fVar34;
            fVar38 = local_58._4_4_ * (fVar45 * -0.5 * fVar38 * fVar38 + 1.5) * fVar38;
            for (lVar18 = 0; (ulong)uVar21 * 10 - lVar18 != 0; lVar18 = lVar18 + 10) {
              fVar44 = (float)(int)*(short *)((long)&comp_verts->x + lVar18);
              fVar45 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cx + lVar18) <<
                                          0x30) >> 0x30);
              fVar41 = (float)(int)*(short *)((long)&comp_verts->y + lVar18);
              fVar43 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cy + lVar18) <<
                                          0x30) >> 0x30);
              auVar36._0_4_ = (int)((fVar41 * fVar42 + fVar44 * fVar40 + (float)iVar32) * fVar34);
              auVar36._4_4_ = (int)((fVar41 * fVar39 + fVar44 * fVar35 + (float)iVar33) * fVar38);
              auVar36._8_4_ = (int)((fVar43 * fVar42 + fVar45 * fVar40 + (float)iVar32) * fVar34);
              auVar36._12_4_ = (int)((fVar43 * fVar39 + fVar45 * fVar35 + (float)iVar33) * fVar38);
              auVar37 = packssdw(auVar36,auVar36);
              *(long *)((long)&comp_verts->x + lVar18) = auVar37._0_8_;
            }
            dst0 = (nk_tt_vertex *)
                   (*alloc->alloc)(alloc->userdata,(void *)0x0,(ulong)(uVar21 + uVar14) * 10);
            if (dst0 == (nk_tt_vertex *)0x0) {
              if (vertices != (nk_tt_vertex *)0x0) {
                (*alloc->free)(alloc->userdata,vertices);
              }
              if (pnVar28 != (nk_tt_vertex *)0x0) {
                (*alloc->free)(alloc->userdata,pnVar28);
              }
              goto LAB_0013f979;
            }
            if (0 < (int)uVar14) {
              nk_memcopy(dst0,vertices,(ulong)uVar14 * 10);
            }
            nk_memcopy(dst0 + uVar14,pnVar28,(ulong)uVar21 * 10);
            if (vertices != (nk_tt_vertex *)0x0) {
              (*alloc->free)(alloc->userdata,vertices);
            }
            (*alloc->free)(alloc->userdata,pnVar28);
            info = local_40;
            vertices = dst0;
            uVar14 = uVar21 + uVar14;
          }
          puVar17 = local_d8;
        }
      }
      else {
        if ((short)((ushort)puVar5[uVar16] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x2cb5,
                        "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                       );
        }
        uVar14 = 0;
        vertices = (nk_tt_vertex *)0x0;
      }
    }
    else {
      uVar20 = (ulong)((uint)uVar12 * 2);
      bVar25 = puVar5[uVar20 + uVar16 + 10];
      bVar24 = puVar5[uVar20 + uVar16 + 0xb];
      bVar2 = puVar5[uVar20 + uVar16 + 8];
      bVar3 = puVar5[uVar20 + uVar16 + 9];
      uVar14 = (uint)bVar2 * 0x100 + (uint)bVar3;
      local_58 = (ulong)uVar14;
      vertices = (nk_tt_vertex *)
                 (*alloc->alloc)(alloc->userdata,(void *)0x0,
                                 ((long)uVar14 + (ulong)uVar12 * 2) * 10 + 10);
      if (vertices == (nk_tt_vertex *)0x0) {
        return 0;
      }
      puVar17 = (ushort *)(puVar5 + (ulong)bVar25 * 0x100 + (ulong)bVar24 + uVar20 + uVar16 + 0xc);
      uVar20 = uVar20 & 0xffff;
      lVar18 = (ulong)(CONCAT11(bVar2,bVar3) + 1) * 10;
      bVar24 = 0;
      bVar25 = 0;
      for (lVar23 = 0; lVar18 - lVar23 != 0; lVar23 = lVar23 + 10) {
        if (bVar24 == 0) {
          bVar25 = (byte)*puVar17;
          if ((bVar25 & 8) == 0) {
            puVar17 = (ushort *)((long)puVar17 + 1);
            bVar24 = 0;
          }
          else {
            bVar24 = *(byte *)((long)puVar17 + 1);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          bVar24 = bVar24 - 1;
        }
        (&vertices[uVar20].type)[lVar23] = bVar25;
      }
      sVar27 = 0;
      for (lVar23 = 0; lVar18 - lVar23 != 0; lVar23 = lVar23 + 10) {
        bVar25 = (&vertices[uVar20].type)[lVar23];
        if ((bVar25 & 2) == 0) {
          if ((bVar25 & 0x10) == 0) {
            sVar27 = sVar27 + (*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          uVar13 = *puVar17;
          puVar17 = (ushort *)((long)puVar17 + 1);
          uVar26 = -(ushort)(byte)uVar13;
          if ((bVar25 & 0x10) != 0) {
            uVar26 = (ushort)(byte)uVar13;
          }
          sVar27 = sVar27 + uVar26;
        }
        *(short *)((long)&vertices[uVar20].x + lVar23) = sVar27;
      }
      sVar27 = 0;
      for (lVar23 = 0; lVar18 - lVar23 != 0; lVar23 = lVar23 + 10) {
        bVar25 = (&vertices[uVar20].type)[lVar23];
        if ((bVar25 & 4) == 0) {
          if ((bVar25 & 0x20) == 0) {
            sVar27 = sVar27 + (*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          uVar13 = *puVar17;
          puVar17 = (ushort *)((long)puVar17 + 1);
          uVar26 = -(ushort)(byte)uVar13;
          if ((bVar25 & 0x20) != 0) {
            uVar26 = (ushort)(byte)uVar13;
          }
          sVar27 = sVar27 + uVar26;
        }
        *(short *)((long)&vertices[uVar20].y + lVar23) = sVar27;
      }
      iVar32 = 0;
      uVar14 = 0;
      local_c8 = 0;
      iVar33 = 0;
      uVar20 = 0;
      sy = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_98._0_8_;
      local_98 = auVar10 << 0x40;
      nVar30 = 0;
      iVar31 = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_88._0_8_;
      local_88 = auVar11 << 0x40;
      iVar15 = 0;
      num_vertices = 0;
      while( true ) {
        auVar37 = local_88;
        cx = (int)local_c8;
        if ((int)(float)local_58 < iVar15) break;
        lVar18 = (long)(int)(iVar15 + (uint)uVar12 * 2);
        bVar25 = vertices[lVar18].type;
        sVar27 = vertices[lVar18].x;
        sVar4 = vertices[lVar18].y;
        uVar21 = (uint)sVar27;
        uVar22 = (ulong)uVar21;
        iVar29 = (int)sVar4;
        if (iVar31 == iVar15) {
          if (iVar31 != 0) {
            num_vertices = nk_tt__close_shape(vertices,num_vertices,iVar32,uVar14,(nk_int)uVar20,sy,
                                              local_98._0_4_,nVar30,cx,iVar33);
          }
          uVar20 = local_98._0_8_;
          iVar15 = iVar31;
          sy = iVar29;
          if ((bVar25 & 1) == 0) {
            uVar20 = uVar22;
            nVar30 = iVar29;
            if ((vertices[lVar18 + 1].type & 1) == 0) {
              uVar22 = (ulong)(uint)((int)((int)vertices[lVar18 + 1].x + uVar21) >> 1);
              sy = vertices[lVar18 + 1].y + iVar29 >> 1;
            }
            else {
              uVar22 = (ulong)(uint)(int)vertices[lVar18 + 1].x;
              iVar15 = iVar31 + 1;
              sy = (int)vertices[lVar18 + 1].y;
            }
          }
          uVar14 = bVar25 & 1 ^ 1;
          vertices[num_vertices].type = '\x01';
          vertices[num_vertices].x = (short)uVar22;
          vertices[num_vertices].y = (short)sy;
          vertices[num_vertices].cx = 0;
          vertices[num_vertices].cy = 0;
          iVar32 = local_88._0_4_;
          iVar31 = (ushort)(*(ushort *)(puVar5 + (long)iVar32 * 2 + uVar16 + 10) << 8 |
                           *(ushort *)(puVar5 + (long)iVar32 * 2 + uVar16 + 10) >> 8) + 1;
          local_88._4_4_ = 0;
          local_88._0_4_ = iVar32 + 1;
          local_88._8_8_ = auVar37._8_8_;
          iVar32 = 0;
          local_98._0_8_ = uVar20;
          uVar20 = uVar22;
          num_vertices = num_vertices + 1;
        }
        else {
          sVar19 = (short)iVar33;
          if ((bVar25 & 1) == 0) {
            if (iVar32 == 0) {
              iVar32 = 1;
              local_c8 = uVar22;
              iVar33 = iVar29;
            }
            else {
              vertices[num_vertices].type = '\x03';
              vertices[num_vertices].x = (short)(cx + uVar21 >> 1);
              vertices[num_vertices].y = (short)((uint)(iVar33 + iVar29) >> 1);
              vertices[num_vertices].cx = (short)local_c8;
              vertices[num_vertices].cy = sVar19;
              iVar32 = 1;
              num_vertices = num_vertices + 1;
              local_c8 = uVar22;
              iVar33 = iVar29;
            }
          }
          else {
            pnVar28 = vertices + num_vertices;
            if (iVar32 == 0) {
              pnVar28->type = '\x02';
              pnVar28->x = sVar27;
              pnVar28->y = sVar4;
              pnVar28->cx = 0;
              sVar19 = 0;
            }
            else {
              pnVar28->type = '\x03';
              pnVar28->x = sVar27;
              pnVar28->y = sVar4;
              pnVar28->cx = (short)local_c8;
            }
            pnVar28->cy = sVar19;
            num_vertices = num_vertices + 1;
            iVar32 = 0;
          }
        }
        iVar15 = iVar15 + 1;
      }
      uVar14 = nk_tt__close_shape(vertices,num_vertices,iVar32,uVar14,(nk_int)uVar20,sy,
                                  local_98._0_4_,nVar30,cx,iVar33);
    }
    *local_38 = vertices;
  }
  return uVar14;
}

Assistant:

NK_INTERN int
nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *info, struct nk_allocator *alloc,
    int glyph_index, struct nk_tt_vertex **pvertices)
{
    nk_short numberOfContours;
    const nk_byte *endPtsOfContours;
    const nk_byte *data = info->data;
    struct nk_tt_vertex *vertices=0;
    int num_vertices=0;
    int g = nk_tt__GetGlyfOffset(info, glyph_index);
    *pvertices = 0;

    if (g < 0) return 0;
    numberOfContours = nk_ttSHORT(data + g);
    if (numberOfContours > 0) {
        nk_byte flags=0,flagcount;
        nk_int ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
        nk_int x,y,cx,cy,sx,sy, scx,scy;
        const nk_byte *points;
        endPtsOfContours = (data + g + 10);
        ins = nk_ttUSHORT(data + g + 10 + numberOfContours * 2);
        points = data + g + 10 + numberOfContours * 2 + 2 + ins;

        n = 1+nk_ttUSHORT(endPtsOfContours + numberOfContours*2-2);
        m = n + 2*numberOfContours;  /* a loose bound on how many vertices we might need */
        vertices = (struct nk_tt_vertex *)alloc->alloc(alloc->userdata, 0, (nk_size)m * sizeof(vertices[0]));
        if (vertices == 0)
            return 0;

        next_move = 0;
        flagcount=0;

        /* in first pass, we load uninterpreted data into the allocated array */
        /* above, shifted to the end of the array so we won't overwrite it when */
        /* we create our final data starting from the front */
        off = m - n; /* starting offset for uninterpreted data, regardless of how m ends up being calculated */

        /* first load flags */
        for (i=0; i < n; ++i) {
            if (flagcount == 0) {
                flags = *points++;
                if (flags & 8)
                    flagcount = *points++;
            } else --flagcount;
            vertices[off+i].type = flags;
        }

        /* now load x coordinates */
        x=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 2) {
                nk_short dx = *points++;
                x += (flags & 16) ? dx : -dx; /* ??? */
            } else {
                if (!(flags & 16)) {
                    x = x + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].x = (nk_short) x;
        }

        /* now load y coordinates */
        y=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 4) {
                nk_short dy = *points++;
                y += (flags & 32) ? dy : -dy; /* ??? */
            } else {
                if (!(flags & 32)) {
                    y = y + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].y = (nk_short) y;
        }

        /* now convert them to our format */
        num_vertices=0;
        sx = sy = cx = cy = scx = scy = 0;
        for (i=0; i < n; ++i)
        {
            flags = vertices[off+i].type;
            x     = (nk_short) vertices[off+i].x;
            y     = (nk_short) vertices[off+i].y;

            if (next_move == i) {
                if (i != 0)
                    num_vertices = nk_tt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

                /* now start the new one                */
                start_off = !(flags & 1);
                if (start_off) {
                    /* if we start off with an off-curve point, then when we need to find a point on the curve */
                    /* where we can start, and we need to save some state for when we wraparound. */
                    scx = x;
                    scy = y;
                    if (!(vertices[off+i+1].type & 1)) {
                        /* next point is also a curve point, so interpolate an on-point curve */
                        sx = (x + (nk_int) vertices[off+i+1].x) >> 1;
                        sy = (y + (nk_int) vertices[off+i+1].y) >> 1;
                    } else {
                        /* otherwise just use the next point as our start point */
                        sx = (nk_int) vertices[off+i+1].x;
                        sy = (nk_int) vertices[off+i+1].y;
                        ++i; /* we're using point i+1 as the starting point, so skip it */
                    }
                } else {
                    sx = x;
                    sy = y;
                }
                nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vmove,sx,sy,0,0);
                was_off = 0;
                next_move = 1 + nk_ttUSHORT(endPtsOfContours+j*2);
                ++j;
            } else {
                if (!(flags & 1))
                { /* if it's a curve */
                    if (was_off) /* two off-curve control points in a row means interpolate an on-curve midpoint */
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
                    cx = x;
                    cy = y;
                    was_off = 1;
                } else {
                    if (was_off)
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, x,y, cx, cy);
                    else nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vline, x,y,0,0);
                    was_off = 0;
                }
            }
        }
        num_vertices = nk_tt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
    } else if (numberOfContours == -1) {
        /* Compound shapes. */
        int more = 1;
        const nk_byte *comp = data + g + 10;
        num_vertices = 0;
        vertices = 0;

        while (more)
        {
            nk_ushort flags, gidx;
            int comp_num_verts = 0, i;
            struct nk_tt_vertex *comp_verts = 0, *tmp = 0;
            float mtx[6] = {1,0,0,1,0,0}, m, n;

            flags = (nk_ushort)nk_ttSHORT(comp); comp+=2;
            gidx = (nk_ushort)nk_ttSHORT(comp); comp+=2;

            if (flags & 2) { /* XY values */
                if (flags & 1) { /* shorts */
                    mtx[4] = nk_ttSHORT(comp); comp+=2;
                    mtx[5] = nk_ttSHORT(comp); comp+=2;
                } else {
                    mtx[4] = nk_ttCHAR(comp); comp+=1;
                    mtx[5] = nk_ttCHAR(comp); comp+=1;
                }
            } else {
                /* @TODO handle matching point */
                NK_ASSERT(0);
            }
            if (flags & (1<<3)) { /* WE_HAVE_A_SCALE */
                mtx[0] = mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
            } else if (flags & (1<<6)) { /* WE_HAVE_AN_X_AND_YSCALE */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            } else if (flags & (1<<7)) { /* WE_HAVE_A_TWO_BY_TWO */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[2] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            }

             /* Find transformation scales. */
            m = (float) NK_SQRT(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
            n = (float) NK_SQRT(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

             /* Get indexed glyph. */
            comp_num_verts = nk_tt_GetGlyphShape(info, alloc, gidx, &comp_verts);
            if (comp_num_verts > 0)
            {
                /* Transform vertices. */
                for (i = 0; i < comp_num_verts; ++i) {
                    struct nk_tt_vertex* v = &comp_verts[i];
                    short x,y;
                    x=v->x; y=v->y;
                    v->x = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->y = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                    x=v->cx; y=v->cy;
                    v->cx = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->cy = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                }
                /* Append vertices. */
                tmp = (struct nk_tt_vertex*)alloc->alloc(alloc->userdata, 0,
                    (nk_size)(num_vertices+comp_num_verts)*sizeof(struct nk_tt_vertex));
                if (!tmp) {
                    if (vertices) alloc->free(alloc->userdata, vertices);
                    if (comp_verts) alloc->free(alloc->userdata, comp_verts);
                    return 0;
                }
                if (num_vertices > 0) NK_MEMCPY(tmp, vertices, (nk_size)num_vertices*sizeof(struct nk_tt_vertex));
                NK_MEMCPY(tmp+num_vertices, comp_verts, (nk_size)comp_num_verts*sizeof(struct nk_tt_vertex));
                if (vertices) alloc->free(alloc->userdata,vertices);
                vertices = tmp;
                alloc->free(alloc->userdata,comp_verts);
                num_vertices += comp_num_verts;
            }
            /* More components ? */
            more = flags & (1<<5);
        }
    } else if (numberOfContours < 0) {
        /* @TODO other compound variations? */
        NK_ASSERT(0);
    } else {
        /* numberOfCounters == 0, do nothing */
    }
    *pvertices = vertices;
    return num_vertices;
}